

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O0

bool empty_port::impl<(empty_port::Kind)0>::
     wait_port_impl<std::chrono::duration<long,std::ratio<1l,1000l>>>
               (port_t port,char *host,duration<long,_std::ratio<1L,_1000L>_> max_wait)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  int local_44;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop_at;
  char *host_local;
  duration<long,_std::ratio<1L,_1000L>_> dStack_18;
  port_t port_local;
  duration<long,_std::ratio<1L,_1000L>_> max_wait_local;
  
  stop_at.__d.__r = (duration)(duration)host;
  dStack_18.__r = max_wait.__r;
  local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_30 = std::chrono::operator+(&local_38,&stack0xffffffffffffffe8);
  do {
    bVar1 = check_port_impl(port,(char *)stop_at.__d.__r);
    if (!bVar1) {
      return true;
    }
    local_44 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_40,&local_44);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_40);
    local_50.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    bVar1 = std::chrono::operator<(&local_50,&local_30);
  } while (bVar1);
  return false;
}

Assistant:

inline bool impl<TCP>::wait_port_impl(const port_t port, const char *host,
                                      D max_wait) {
    auto stop_at = clock_t::now() + max_wait;
    do {
        if (!impl<TCP>::check_port_impl(port, host)) {
            return true;
        }
        std::this_thread::sleep_for(D(1));
    } while (clock_t::now() < stop_at);

    return false;
}